

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimalControlProblem.cpp
# Opt level: O0

void __thiscall
iDynTree::optimalcontrol::anon_struct_816_18_fcbdc1fc::resizeBuffers<unsigned_long>
          (anon_struct_816_18_fcbdc1fc *this,unsigned_long stateDim,unsigned_long controlDim)

{
  uint uVar1;
  element_type *peVar2;
  uint in_EDX;
  uint in_ESI;
  long in_RDI;
  uint nu;
  uint nx;
  
  peVar2 = std::
           __shared_ptr_access<iDynTree::optimalcontrol::ConstraintsGroup,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<iDynTree::optimalcontrol::ConstraintsGroup,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x30411f);
  uVar1 = ConstraintsGroup::constraintsDimension(peVar2);
  iDynTree::MatrixDynSize::resize(in_RDI + 0x30,(ulong)uVar1);
  peVar2 = std::
           __shared_ptr_access<iDynTree::optimalcontrol::ConstraintsGroup,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<iDynTree::optimalcontrol::ConstraintsGroup,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x304150);
  uVar1 = ConstraintsGroup::constraintsDimension(peVar2);
  iDynTree::MatrixDynSize::resize(in_RDI + 0x58,(ulong)uVar1);
  iDynTree::MatrixDynSize::resize(in_RDI + 0x80,(ulong)in_ESI);
  iDynTree::MatrixDynSize::zero();
  iDynTree::MatrixDynSize::resize(in_RDI + 0xa8,(ulong)in_EDX);
  iDynTree::MatrixDynSize::zero();
  iDynTree::MatrixDynSize::resize(in_RDI + 0xd0,(ulong)in_ESI);
  iDynTree::MatrixDynSize::zero();
  return;
}

Assistant:

void resizeBuffers(intType stateDim, intType controlDim) {
                unsigned int nx = static_cast<unsigned int>(stateDim);
                unsigned int nu = static_cast<unsigned int>(controlDim);
                stateJacobianBuffer.resize(group_ptr->constraintsDimension(), nx);
                controlJacobianBuffer.resize(group_ptr->constraintsDimension(), nu);
                stateHessianBuffer.resize(nx, nx);
                stateHessianBuffer.zero();
                controlHessianBuffer.resize(nu, nu);
                controlHessianBuffer.zero();
                mixedHessianBuffer.resize(nx, nu);
                mixedHessianBuffer.zero();
            }